

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_OutlineFigure::Internal_EstimateFigureSegmentCount(ON_OutlineFigure *this)

{
  bool bVar1;
  uint uVar2;
  ON_OutlineFigurePoint *pOVar3;
  uint local_44;
  ON__UINT32 local_40;
  ON__UINT32 i;
  int segment_count;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint *a;
  ON__UINT32 OStack_1c;
  Type point_type;
  ON__UINT32 count;
  ON__UINT32 figure_end_dex;
  ON_OutlineFigure *this_local;
  
  OStack_1c = Internal_FigureEndDex(this,false);
  uVar2 = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this->m_points);
  if ((OStack_1c == 0) || (uVar2 <= OStack_1c)) {
    this_local._4_4_ = 0;
  }
  else {
    a._7_1_ = '\0';
    figure_end.m_point = (ON_2fPoint)ON_SimpleArray<ON_OutlineFigurePoint>::Array(&this->m_points);
    pOVar3 = (ON_OutlineFigurePoint *)((long)figure_end.m_point + (ulong)OStack_1c * 0xc);
    i._0_1_ = pOVar3->m_point_type;
    i._1_1_ = pOVar3->m_point_proximity;
    i._2_2_ = pOVar3->m_figure_index;
    unique0x00012004 = (pOVar3->m_point).x;
    figure_end._0_4_ = (pOVar3->m_point).y;
    bVar1 = ON_OutlineFigurePoint::IsOnFigure((ON_OutlineFigurePoint *)&i);
    if ((((bVar1) && ((Type)i == EndFigureClosed)) &&
        (bVar1 = ON_OutlineFigurePoint::IsOnFigure
                           ((ON_OutlineFigurePoint *)
                            ((long)figure_end.m_point + (ulong)(OStack_1c - 1) * 0xc)), bVar1)) &&
       (bVar1 = ON_2fPoint::operator==
                          ((ON_2fPoint *)
                           ((long)figure_end.m_point + (ulong)(OStack_1c - 1) * 0xc + 4),
                           (ON_2fPoint *)&segment_count), bVar1)) {
      OStack_1c = OStack_1c - 1;
    }
    local_40 = 0;
    for (local_44 = 1; local_44 <= OStack_1c; local_44 = local_44 + 1) {
      bVar1 = ON_OutlineFigurePoint::IsOnFigure
                        ((ON_OutlineFigurePoint *)((long)figure_end.m_point + (ulong)local_44 * 0xc)
                        );
      if ((bVar1) && (*(char *)((long)figure_end.m_point + (ulong)local_44 * 0xc) != a._7_1_)) {
        a._7_1_ = *(char *)((long)figure_end.m_point + (ulong)local_44 * 0xc);
        local_40 = local_40 + 1;
      }
    }
    this_local._4_4_ = local_40;
  }
  return this_local._4_4_;
}

Assistant:

ON__UINT32 ON_OutlineFigure::Internal_EstimateFigureSegmentCount() const
{
  ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
  const ON__UINT32 count = m_points.UnsignedCount();
  if (0 == figure_end_dex || figure_end_dex >= count)
    return 0;

  ON_OutlineFigurePoint::Type point_type = ON_OutlineFigurePoint::Type::Unset;
  const ON_OutlineFigurePoint* a = m_points.Array();
  const ON_OutlineFigurePoint figure_end = a[figure_end_dex];
  if (
    figure_end.IsOnFigure()
    && ON_OutlineFigurePoint::Type::EndFigureClosed == figure_end.m_point_type
    && 0 != a[figure_end_dex - 1].IsOnFigure()
    && a[figure_end_dex - 1].m_point == figure_end.m_point
    )
  {
    // ignore final zero length segment
    figure_end_dex--;
  }

  int segment_count = 0;
  for (ON__UINT32 i = 1; i <= figure_end_dex; i++)
  {
    if (false == a[i].IsOnFigure() || a[i].m_point_type == point_type)
      continue;
    point_type = a[i].m_point_type;
    segment_count++;
  }

  return segment_count;
}